

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O1

void __thiscall
duckdb::MultiFileColumnMapper::ThrowColumnNotFoundError
          (MultiFileColumnMapper *this,string *global_column_name)

{
  pointer pMVar1;
  pointer pcVar2;
  type pBVar3;
  InvalidInputException *this_00;
  MultiFileColumnDefinition *column;
  pointer pMVar4;
  string candidate_names;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  string *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_f8 = global_column_name;
  pBVar3 = shared_ptr<duckdb::BaseFileReader,_true>::operator*(&this->reader_data->reader);
  local_118 = local_108;
  local_110 = 0;
  local_108[0] = 0;
  pMVar4 = (pBVar3->columns).
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           .
           super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (pBVar3->columns).
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           .
           super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar4 != pMVar1) {
    do {
      if (local_110 != 0) {
        ::std::__cxx11::string::append((char *)&local_118);
      }
      ::std::__cxx11::string::_M_append((char *)&local_118,(ulong)(pMVar4->name)._M_dataplus._M_p);
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != pMVar1);
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Failed to read file \"%s\": schema mismatch in glob: column \"%s\" was read from the original file \"%s\", but could not be found in file \"%s\".\nCandidate names: %s\nIf you are trying to read files with different schemas, try setting union_by_name=True"
             ,"");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (pBVar3->file).path._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (pBVar3->file).path._M_string_length);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar2 = (local_f8->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + local_f8->_M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar2 = (this->initial_file->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (this->initial_file->path)._M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar2 = (pBVar3->file).path._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + (pBVar3->file).path._M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_118,local_118 + local_110);
  InvalidInputException::
  InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_50,&local_70,&local_d0,&local_90,&local_f0,&local_b0);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MultiFileColumnMapper::ThrowColumnNotFoundError(const string &global_column_name) const {
	auto &reader = *reader_data.reader;
	auto &local_columns = reader.GetColumns();

	string candidate_names;
	for (auto &column : local_columns) {
		if (!candidate_names.empty()) {
			candidate_names += ", ";
		}
		candidate_names += column.name;
	}
	auto &file_name = reader.GetFileName();
	throw InvalidInputException("Failed to read file \"%s\": schema mismatch in glob: column \"%s\" was read from "
	                            "the original file \"%s\", but could not be found in file \"%s\".\nCandidate names: "
	                            "%s\nIf you are trying to "
	                            "read files with different schemas, try setting union_by_name=True",
	                            file_name, global_column_name, initial_file.path, file_name, candidate_names);
}